

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O2

void __thiscall
duckdb::LogManager::WriteLogEntry
          (LogManager *this,timestamp_t timestamp,char *log_type,LogLevel log_level,
          char *log_message,RegisteredLoggingContext *context)

{
  LogStorage *pLVar1;
  unique_lock<std::mutex> lck;
  allocator local_82;
  allocator local_81;
  unique_lock<std::mutex> local_80;
  string local_70 [32];
  string local_50 [32];
  
  ::std::unique_lock<std::mutex>::unique_lock(&local_80,&this->lock);
  pLVar1 = shared_ptr<duckdb::LogStorage,_true>::operator->(&this->log_storage);
  ::std::__cxx11::string::string(local_50,log_type,&local_81);
  ::std::__cxx11::string::string(local_70,log_message,&local_82);
  (*pLVar1->_vptr_LogStorage[2])(pLVar1,timestamp.value,(ulong)log_level,local_50,local_70,context);
  ::std::__cxx11::string::~string(local_70);
  ::std::__cxx11::string::~string(local_50);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_80);
  return;
}

Assistant:

void LogManager::WriteLogEntry(timestamp_t timestamp, const char *log_type, LogLevel log_level, const char *log_message,
                               const RegisteredLoggingContext &context) {
	unique_lock<mutex> lck(lock);
	log_storage->WriteLogEntry(timestamp, log_level, log_type, log_message, context);
}